

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializers.hpp
# Opt level: O1

XMLNodeAdapter * BSDFData::operator>>(XMLNodeAdapter *node,WavelengthDataBlock *wavelengthDataBlock)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *poVar3
  ;
  WavelengthDataBlock *pWVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *nodeName;
  pointer pbVar6;
  string local_a8;
  ScatteringDataType SStack_84;
  string local_80;
  Child<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  WavelengthDataBlock *local_38;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"WavelengthDataDirection","");
  local_38 = wavelengthDataBlock;
  FileParse::Child<std::optional<BSDFData::WavelengthDataDirection>_>::Child
            ((Child<std::optional<BSDFData::WavelengthDataDirection>_> *)&local_60,&local_80,
             &wavelengthDataBlock->wavelengthDataDirection,0);
  pbVar2 = local_60.nodeNames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = local_60.nodeNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1) {
    (*(node->super_INodeAdapter<XMLNodeAdapter>)._vptr_INodeAdapter[6])
              (&local_a8,node,pbVar6->_M_string_length);
    poVar3 = local_60.data;
    if ((local_a8.field_2._M_local_buf[8] == '\x01') &&
       (iVar5 = (**(code **)(local_a8._M_dataplus._M_p + 0x10))(&local_a8), (char)iVar5 == '\0')) {
      operator>>((XMLNodeAdapter *)&local_a8,&SStack_84);
      (poVar3->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p = (pointer)((ulong)SStack_84 | 0x100000000);
    }
    if (local_a8.field_2._M_local_buf[8] == '\x01') {
      local_a8.field_2._M_local_buf[8] = '\0';
      local_a8._M_dataplus._M_p = (pointer)&PTR__XMLNodeAdapter_001ddbc0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.field_2._M_allocated_capacity !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a8.field_2._M_allocated_capacity);
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60.nodeNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"ColumnAngleBasis","");
  pWVar4 = local_38;
  FileParse::
  Child<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Child(&local_60,&local_a8,&local_38->columnAngleBasis,0);
  FileParse::operator>>(node,&local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60.nodeNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1));
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"RowAngleBasis","");
  FileParse::
  Child<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Child(&local_60,&local_a8,&pWVar4->rowAngleBasis,0);
  FileParse::operator>>(node,&local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60.nodeNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1));
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"ScatteringDataType","");
  FileParse::Child<std::optional<BSDFData::ScatteringDataType>_>::Child
            ((Child<std::optional<BSDFData::ScatteringDataType>_> *)&local_60,&local_80,
             &pWVar4->scatteringDataType,0);
  for (pbVar6 = local_60.nodeNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar6 != local_60.nodeNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
    (*(node->super_INodeAdapter<XMLNodeAdapter>)._vptr_INodeAdapter[6])
              (&local_a8,node,pbVar6->_M_string_length,(pbVar6->_M_dataplus)._M_p);
    poVar3 = local_60.data;
    if ((local_a8.field_2._M_local_buf[8] == '\x01') &&
       (iVar5 = (**(code **)(local_a8._M_dataplus._M_p + 0x10))(&local_a8), (char)iVar5 == '\0')) {
      operator>>((XMLNodeAdapter *)&local_a8,&SStack_84);
      (poVar3->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p = (pointer)((ulong)SStack_84 | 0x100000000);
    }
    if (local_a8.field_2._M_local_buf[8] == '\x01') {
      local_a8.field_2._M_local_buf[8] = '\0';
      local_a8._M_dataplus._M_p = (pointer)&PTR__XMLNodeAdapter_001ddbc0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.field_2._M_allocated_capacity !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a8.field_2._M_allocated_capacity);
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60.nodeNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  operator>>(node,&local_38->scatteringData);
  return node;
}

Assistant:

const NodeAdapter & operator>>(const NodeAdapter & node,
                                   BSDFData::WavelengthDataBlock & wavelengthDataBlock)
    {
        node >> FileParse::Child{"WavelengthDataDirection",
                                 wavelengthDataBlock.wavelengthDataDirection};
        node >> FileParse::Child{"ColumnAngleBasis", wavelengthDataBlock.columnAngleBasis};
        node >> FileParse::Child{"RowAngleBasis", wavelengthDataBlock.rowAngleBasis};
        node >> FileParse::Child{"ScatteringDataType", wavelengthDataBlock.scatteringDataType};
        // Child node name is moved down to the ScatteringData serializer since compiler cannot
        // resolve between serializer of std::vector<std::vector<double>> and Child<std::vector<T>>
        // defined in FileParse
        node >> wavelengthDataBlock.scatteringData;

        return node;
    }